

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::MinkowskiSum(Path *pattern,Paths *paths,Paths *solution,bool pathIsClosed)

{
  pointer pvVar1;
  pointer pvVar2;
  const_reference path;
  ClipperLib *this;
  const_reference pvVar3;
  ulong uVar4;
  IntPoint delta;
  undefined1 local_188 [8];
  Path tmp2;
  undefined1 local_160 [8];
  Paths tmp;
  size_t i;
  Clipper c;
  bool pathIsClosed_local;
  Paths *solution_local;
  Paths *paths_local;
  Path *pattern_local;
  
  c._279_1_ = pathIsClosed;
  Clipper::Clipper((Clipper *)&i,0);
  tmp.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pvVar1 = tmp.
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar2 = (pointer)std::
                      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                      ::size(paths);
    if (pvVar2 <= pvVar1) break;
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              *)local_160);
    path = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](paths,(size_type)
                              tmp.
                              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar4 = (ulong)((byte)c._279_1_ & 1);
    Minkowski(pattern,path,
              (vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)local_160,true,SUB41((byte)c._279_1_ & 1,0));
    ClipperBase::AddPaths
              ((ClipperBase *)((long)&i + *(long *)(i - 0x18)),(Paths *)local_160,ptSubject,true);
    if ((c._279_1_ & 1) != 0) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_188);
      this = (ClipperLib *)
             std::
             vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ::operator[](paths,(size_type)
                                tmp.
                                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (pattern,0);
      delta.Y = uVar4;
      delta.X = pvVar3->Y;
      TranslatePath(this,(vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                         local_188,(Path *)pvVar3->X,delta);
      ClipperBase::AddPath
                ((ClipperBase *)((long)&i + *(long *)(i - 0x18)),(Path *)local_188,ptClip,true);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_188);
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)local_160);
    tmp.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((tmp.
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  Clipper::Execute((Clipper *)&i,ctUnion,solution,pftNonZero,pftNonZero);
  Clipper::~Clipper((Clipper *)&i);
  return;
}

Assistant:

void MinkowskiSum(const Path& pattern, const Paths& paths, Paths& solution, bool pathIsClosed)
{
  Clipper c;
  for (size_t i = 0; i < paths.size(); ++i)
  {
    Paths tmp;
    Minkowski(pattern, paths[i], tmp, true, pathIsClosed);
    c.AddPaths(tmp, ptSubject, true);
    if (pathIsClosed)
    {
      Path tmp2;
      TranslatePath(paths[i], tmp2, pattern[0]);
      c.AddPath(tmp2, ptClip, true);
    }
  }
    c.Execute(ctUnion, solution, pftNonZero, pftNonZero);
}